

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void xmlListClear(xmlListPtr l)

{
  xmlLinkPtr pxVar1;
  _xmlLink *p_Var2;
  xmlLinkPtr pxVar3;
  
  if ((l != (xmlListPtr)0x0) && (pxVar3 = l->sentinel->next, pxVar3 != l->sentinel)) {
    do {
      pxVar1 = pxVar3->next;
      p_Var2 = pxVar3->prev;
      p_Var2->next = pxVar1;
      pxVar3->next->prev = p_Var2;
      if (l->linkDeallocator != (_func_void_xmlLinkPtr *)0x0) {
        (*l->linkDeallocator)(pxVar3);
      }
      (*xmlFree)(pxVar3);
      pxVar3 = pxVar1;
    } while (pxVar1 != l->sentinel);
  }
  return;
}

Assistant:

void
xmlListClear(xmlListPtr l)
{
    xmlLinkPtr  lk;

    if (l == NULL)
        return;
    lk = l->sentinel->next;
    while(lk != l->sentinel) {
        xmlLinkPtr next = lk->next;

        xmlLinkDeallocator(l, lk);
        lk = next;
    }
}